

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Response_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Action_Response_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Action_Response_PDU *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pKVar3;
  pointer pKVar4;
  KString *pKVar5;
  ostream *poVar6;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  pointer pKVar7;
  pointer pKVar8;
  KStringStream ss;
  KString local_228;
  KString local_208;
  KString *local_1e8;
  Action_Response_PDU *local_1e0;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_228,(Header7 *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-Action Request PDU-\n",0x15);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_208,(Simulation_Management_Header *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tRequest ID:               ",0x1b);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\tRequest Status:           ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringRequestStatus_abi_cxx11_
            (&local_1d8,(ENUMS *)(ulong)this->m_ui32RequestStatus,Value);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\tNumber Fixed Datum:       ",0x1c);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\tNumber Variable Datum:    ",0x1c);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_208.field_2;
  local_1e8 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Fixed Datum:\n",0xd);
  pKVar8 = (this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar3 = (this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = this;
  if (pKVar8 != pKVar3) {
    do {
      (*(pKVar8->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_208);
      UTILS::IndentString(&local_228,&local_208,Tabs,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      pKVar8 = pKVar8 + 1;
    } while (pKVar8 != pKVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Variable Datum:\n",0x10);
  pKVar7 = (local_1e0->super_Data_PDU).super_Comment_PDU.m_vVariableDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar4 = (local_1e0->super_Data_PDU).super_Comment_PDU.m_vVariableDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar7 != pKVar4) {
    do {
      (*(pKVar7->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_208);
      UTILS::IndentString(&local_228,&local_208,Tabs_00,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar4);
  }
  pKVar5 = local_1e8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar5;
}

Assistant:

KString Action_Response_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Action Request PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:               "   << m_ui32RequestID
       << "\n\tRequest Status:           " << GetEnumAsStringRequestStatus( m_ui32RequestStatus )
       << "\n\tNumber Fixed Datum:       " << m_ui32NumFixedDatum
       << "\n\tNumber Variable Datum:    " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum:\n";
    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << IndentString( ( *citrFixed )->GetAsString() );
    }

    ss << "Variable Datum:\n";
    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << IndentString( ( *citrVar )->GetAsString() );
    }

    return ss.str();
}